

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_TgExpendSymmetry(Abc_TgMan_t *pMan,char *pDest)

{
  char cVar1;
  int iVar2;
  char *pPerm;
  int s;
  int k;
  int j;
  int i;
  char *pDest_local;
  Abc_TgMan_t *pMan_local;
  
  k = 0;
  for (s = 0; iVar2 = k, s < pMan->nGVars; s = s + 1) {
    cVar1 = pMan->pPerm[s];
    while (pPerm._4_4_ = (int)cVar1, -1 < pPerm._4_4_) {
      pDest[k] = cVar1;
      k = k + 1;
      cVar1 = pMan->symLink[pPerm._4_4_];
    }
  }
  cVar1 = pMan->symLink[pMan->nVars];
  while (pPerm._4_4_ = (int)cVar1, -1 < pPerm._4_4_) {
    pDest[k] = cVar1;
    k = k + 1;
    cVar1 = pMan->symLink[pPerm._4_4_];
  }
  if (k == pMan->nVars) {
    return iVar2;
  }
  __assert_fail("i == pMan->nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                ,0x7c1,"int Abc_TgExpendSymmetry(Abc_TgMan_t *, char *)");
}

Assistant:

int Abc_TgExpendSymmetry(Abc_TgMan_t * pMan, char * pDest)
{
    int i = 0, j, k, s;
    char * pPerm = pMan->pPerm;
    for (j = 0; j < pMan->nGVars; j++)
        for (k = pPerm[j]; k >= 0; k = pMan->symLink[k])
            pDest[i++] = k;
    s = i;
    for (k = pMan->symLink[pMan->nVars]; k >= 0; k = pMan->symLink[k])
        pDest[i++] = k;
    assert(i == pMan->nVars);
    return s;
}